

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O2

void __thiscall
PolicyPureVector::PolicyPureVector
          (PolicyPureVector *this,I_PtPD_constPtr *pu,Index agentI,PolicyDomainCategory idc,
          size_t depth)

{
  uint uVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  allocator_type local_3d;
  value_type_conflict1 local_3c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  PolicyDiscretePure::PolicyDiscretePure(&this->super_PolicyDiscretePure,pu,idc,agentI);
  (this->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._vptr_Policy =
       (_func_int **)&PTR__PolicyPureVector_005e59a0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar2 = PolicyDiscretePure::GetInterfacePTPDiscretePure(&this->super_PolicyDiscretePure);
  uVar1 = (*(pIVar2->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[5])
                    (pIVar2,(ulong)agentI,
                     (ulong)(this->super_PolicyDiscretePure).super_PolicyDiscrete._m_indexDomCat,
                     depth);
  *(Index *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34 = agentI;
  local_3c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,(ulong)uVar1,&local_3c
             ,&local_3d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_m_domainToActionIndices,&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

PolicyPureVector::PolicyPureVector(
    const I_PtPD_constPtr &pu,
    Index agentI,
    PolicyGlobals::PolicyDomainCategory idc,
    size_t depth
        ) :
     PolicyDiscretePure(pu,idc, agentI)
{
    Index nrDE = GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(agentI, GetPolicyDomainCategory(), depth);
    if(DEBUG_PPV)
        cout << "PolicyPureVector(): creating policy for agent "<<agentI
             << ", depth " << depth << " (nr domain elements "
             << nrDE << ")" << endl;

    _m_agentI = agentI;
    _m_domainToActionIndices = vector<Index>(nrDE, 0);
}